

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_test.cxx
# Opt level: O0

int raft_server_test::update_params_test(void)

{
  initializer_list<RaftPkg_*> __l;
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  ostream *poVar4;
  size_t sVar5;
  void *pvVar6;
  element_type *peVar7;
  int __how;
  int __how_00;
  int __how_01;
  int __fd;
  int _v_2;
  int _ev;
  int old_value;
  raft_params param;
  RaftPkg *pp;
  RaftPkg **entry;
  iterator __end1;
  iterator __begin1;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *__range1;
  int _v_1;
  int _v;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> pkgs;
  RaftPkg s3;
  RaftPkg s2;
  RaftPkg s1;
  string s3_addr;
  string s2_addr;
  string s1_addr;
  ptr<FakeNetworkBase> f_base;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *in_stack_fffffffffffff608;
  RaftPkg *in_stack_fffffffffffff610;
  raft_server *in_stack_fffffffffffff620;
  allocator_type *in_stack_fffffffffffff638;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *in_stack_fffffffffffff640;
  iterator in_stack_fffffffffffff648;
  size_type in_stack_fffffffffffff650;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *in_stack_fffffffffffff660;
  raft_params *in_stack_fffffffffffff678;
  raft_server *in_stack_fffffffffffff680;
  ptr<FakeNetworkBase> *in_stack_fffffffffffff688;
  RaftPkg *in_stack_fffffffffffff690;
  undefined8 in_stack_fffffffffffff7d8;
  undefined1 restart;
  raft_params *in_stack_fffffffffffff7e0;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *in_stack_fffffffffffff7e8;
  string local_650 [36];
  int local_62c;
  int local_628;
  undefined1 local_624 [104];
  int local_5bc;
  raft_params local_5b8;
  RaftPkg *local_550;
  reference local_548;
  RaftPkg **local_540;
  __normal_iterator<RaftPkg_**,_std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>_> local_538;
  undefined1 *local_530;
  native_handle_type local_528;
  char local_51d;
  int local_51c;
  string local_518 [32];
  int local_4f8;
  undefined4 local_4f4;
  native_handle_type local_4f0;
  char local_4e5;
  int local_4e4;
  string local_4e0 [32];
  int local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  undefined1 **local_4a0;
  undefined8 local_498;
  undefined1 local_490 [24];
  undefined1 local_478 [320];
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *in_stack_fffffffffffffcc8;
  undefined1 local_330 [328];
  undefined1 local_1e8 [335];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [52];
  int local_4;
  
  restart = (undefined1)((ulong)in_stack_fffffffffffff7d8 >> 0x38);
  raft_functional_common::reset_log_files();
  nuraft::cs_new<nuraft::FakeNetworkBase>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"S1",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"S2",&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"S3",&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  RaftPkg::RaftPkg(in_stack_fffffffffffff690,in_stack_fffffffffffff688,
                   (int)((ulong)in_stack_fffffffffffff680 >> 0x20),
                   (string *)in_stack_fffffffffffff678);
  RaftPkg::RaftPkg(in_stack_fffffffffffff690,in_stack_fffffffffffff688,
                   (int)((ulong)in_stack_fffffffffffff680 >> 0x20),
                   (string *)in_stack_fffffffffffff678);
  RaftPkg::RaftPkg(in_stack_fffffffffffff690,in_stack_fffffffffffff688,
                   (int)((ulong)in_stack_fffffffffffff680 >> 0x20),
                   (string *)in_stack_fffffffffffff678);
  local_4b8 = local_1e8;
  local_4b0 = local_330;
  local_4a8 = local_478;
  local_4a0 = &local_4b8;
  local_498 = 3;
  std::allocator<RaftPkg_*>::allocator((allocator<RaftPkg_*> *)0x114666);
  __l._M_len = in_stack_fffffffffffff650;
  __l._M_array = in_stack_fffffffffffff648;
  std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::vector
            (in_stack_fffffffffffff640,__l,in_stack_fffffffffffff638);
  std::allocator<RaftPkg_*>::~allocator((allocator<RaftPkg_*> *)0x11469a);
  local_4c0 = launch_servers(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,(bool)restart);
  if (local_4c0 == 0) {
    local_4f8 = make_group(in_stack_fffffffffffffcc8);
    if (local_4f8 == 0) {
      local_530 = local_490;
      local_538._M_current =
           (RaftPkg **)
           std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::begin(in_stack_fffffffffffff608);
      local_540 = (RaftPkg **)
                  std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::end(in_stack_fffffffffffff608)
      ;
      while( true ) {
        __fd = (int)&local_540;
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<RaftPkg_**,_std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>_>
                            *)in_stack_fffffffffffff610,
                           (__normal_iterator<RaftPkg_**,_std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>_>
                            *)in_stack_fffffffffffff608);
        if (!bVar1) break;
        local_548 = __gnu_cxx::
                    __normal_iterator<RaftPkg_**,_std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>_>
                    ::operator*(&local_538);
        local_550 = *local_548;
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x115242);
        nuraft::raft_server::get_current_params(in_stack_fffffffffffff620);
        local_5bc = local_5b8.election_timeout_upper_bound_;
        nuraft::raft_params::with_election_timeout_upper
                  (&local_5b8,local_5b8.election_timeout_upper_bound_ + 1);
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x11528e);
        nuraft::raft_server::update_params(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1152b4);
        nuraft::raft_server::get_current_params(in_stack_fffffffffffff620);
        memcpy(&local_5b8,local_624,0x67);
        local_628 = local_5bc + 1;
        local_62c = local_5b8.election_timeout_upper_bound_;
        if (local_628 != local_5b8.election_timeout_upper_bound_) {
          poVar4 = (ostream *)
                   std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<(poVar4,"        time: ");
          poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
          TestSuite::getTimeString_abi_cxx11_();
          poVar4 = std::operator<<(poVar4,local_650);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"      thread: ");
          poVar4 = std::operator<<(poVar4,"\x1b[33m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
          _Var3 = std::setw(4);
          poVar4 = std::operator<<(poVar4,_Var3);
          _Var2 = std::setfill<char>('0');
          poVar4 = std::operator<<(poVar4,_Var2._M_c);
          std::this_thread::get_id();
          sVar5 = std::hash<std::thread::id>::operator()
                            ((hash<std::thread::id> *)in_stack_fffffffffffff610,
                             (id *)in_stack_fffffffffffff608);
          pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
          poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"          in: ");
          poVar4 = std::operator<<(poVar4,"\x1b[36m");
          poVar4 = std::operator<<(poVar4,"update_params_test");
          poVar4 = std::operator<<(poVar4,"()\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"          at: ");
          poVar4 = std::operator<<(poVar4,"\x1b[32m");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                  );
          poVar4 = std::operator<<(poVar4,"\x1b[0m:");
          poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xff);
          poVar4 = std::operator<<(poVar4,"\x1b[0m");
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,
                                   "    value of: \x1b[1;34mparam.election_timeout_upper_bound_\x1b[0m\n"
                                  );
          poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_628);
          in_stack_fffffffffffff620 = (raft_server *)std::operator<<(poVar4,"\x1b[0m\n");
          poVar4 = std::operator<<((ostream *)in_stack_fffffffffffff620,"      actual: \x1b[1;31m");
          in_stack_fffffffffffff610 = (RaftPkg *)std::ostream::operator<<(poVar4,local_62c);
          std::operator<<((ostream *)in_stack_fffffffffffff610,"\x1b[0m\n");
          std::__cxx11::string::~string(local_650);
          TestSuite::failHandler();
          local_4 = -1;
          goto LAB_00115825;
        }
        __gnu_cxx::
        __normal_iterator<RaftPkg_**,_std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>_>::
        operator++(&local_538);
      }
      print_stats(in_stack_fffffffffffff660);
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1157c0);
      nuraft::raft_server::shutdown(peVar7,__fd,__how);
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1157d7);
      nuraft::raft_server::shutdown(peVar7,__fd,__how_00);
      peVar7 = std::
               __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1157ee);
      nuraft::raft_server::shutdown(peVar7,__fd,__how_01);
      std::__shared_ptr_access<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x115805);
      nuraft::FakeNetworkBase::destroy((FakeNetworkBase *)in_stack_fffffffffffff610);
      local_4 = 0;
    }
    else {
      poVar4 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,"        time: ");
      poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,local_518);
      poVar4 = std::operator<<(poVar4,"\x1b[0m");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"      thread: ");
      poVar4 = std::operator<<(poVar4,"\x1b[33m");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
      local_51c = (int)std::setw(4);
      poVar4 = std::operator<<(poVar4,(_Setw)local_51c);
      local_51d = (char)std::setfill<char>('0');
      poVar4 = std::operator<<(poVar4,local_51d);
      local_528 = (native_handle_type)std::this_thread::get_id();
      sVar5 = std::hash<std::thread::id>::operator()
                        ((hash<std::thread::id> *)in_stack_fffffffffffff610,
                         (id *)in_stack_fffffffffffff608);
      pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
      poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
      poVar4 = std::operator<<(poVar4,"\x1b[0m");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"          in: ");
      poVar4 = std::operator<<(poVar4,"\x1b[36m");
      poVar4 = std::operator<<(poVar4,"update_params_test");
      poVar4 = std::operator<<(poVar4,"()\x1b[0m");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"          at: ");
      poVar4 = std::operator<<(poVar4,"\x1b[32m");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                              );
      poVar4 = std::operator<<(poVar4,"\x1b[0m:");
      poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xf5);
      poVar4 = std::operator<<(poVar4,"\x1b[0m");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"    value of: \x1b[1;34mmake_group( pkgs )\x1b[0m\n");
      poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
      poVar4 = std::operator<<(poVar4,"0");
      poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
      poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_4f8);
      std::operator<<(poVar4,"\x1b[0m\n");
      std::__cxx11::string::~string(local_518);
      TestSuite::failHandler();
      local_4 = -1;
    }
  }
  else {
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"        time: ");
    poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_4e0);
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"      thread: ");
    poVar4 = std::operator<<(poVar4,"\x1b[33m");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
    local_4e4 = (int)std::setw(4);
    poVar4 = std::operator<<(poVar4,(_Setw)local_4e4);
    local_4e5 = (char)std::setfill<char>('0');
    poVar4 = std::operator<<(poVar4,local_4e5);
    local_4f0 = (native_handle_type)std::this_thread::get_id();
    sVar5 = std::hash<std::thread::id>::operator()
                      ((hash<std::thread::id> *)in_stack_fffffffffffff610,
                       (id *)in_stack_fffffffffffff608);
    pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"          in: ");
    poVar4 = std::operator<<(poVar4,"\x1b[36m");
    poVar4 = std::operator<<(poVar4,"update_params_test");
    poVar4 = std::operator<<(poVar4,"()\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"          at: ");
    poVar4 = std::operator<<(poVar4,"\x1b[32m");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                            );
    poVar4 = std::operator<<(poVar4,"\x1b[0m:");
    poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xf4);
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    value of: \x1b[1;34mlaunch_servers( pkgs )\x1b[0m\n");
    poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
    poVar4 = std::operator<<(poVar4,"0");
    poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
    poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_4c0);
    std::operator<<(poVar4,"\x1b[0m\n");
    std::__cxx11::string::~string(local_4e0);
    TestSuite::failHandler();
    local_4 = -1;
  }
LAB_00115825:
  local_4f4 = 1;
  std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::~vector
            ((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)in_stack_fffffffffffff620);
  RaftPkg::~RaftPkg(in_stack_fffffffffffff610);
  RaftPkg::~RaftPkg(in_stack_fffffffffffff610);
  RaftPkg::~RaftPkg(in_stack_fffffffffffff610);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  std::shared_ptr<nuraft::FakeNetworkBase>::~shared_ptr
            ((shared_ptr<nuraft::FakeNetworkBase> *)0x11588d);
  return local_4;
}

Assistant:

int update_params_test() {
    reset_log_files();
    ptr<FakeNetworkBase> f_base = cs_new<FakeNetworkBase>();

    std::string s1_addr = "S1";
    std::string s2_addr = "S2";
    std::string s3_addr = "S3";

    RaftPkg s1(f_base, 1, s1_addr);
    RaftPkg s2(f_base, 2, s2_addr);
    RaftPkg s3(f_base, 3, s3_addr);
    std::vector<RaftPkg*> pkgs = {&s1, &s2, &s3};

    CHK_Z( launch_servers( pkgs ) );
    CHK_Z( make_group( pkgs ) );

    for (auto& entry: pkgs) {
        RaftPkg* pp = entry;
        raft_params param = pp->raftServer->get_current_params();
        int old_value = param.election_timeout_upper_bound_;
        param.with_election_timeout_upper( old_value + 1 );
        pp->raftServer->update_params(param);

        param = pp->raftServer->get_current_params();
        CHK_EQ( old_value + 1, param.election_timeout_upper_bound_ );
    }

    print_stats(pkgs);

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();

    f_base->destroy();

    return 0;
}